

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

double __thiscall sector_t::FindNextHighestCeiling(sector_t *this,vertex_t **v)

{
  secplane_t *this_00;
  line_t_conflict *line;
  bool bVar1;
  sector_t_conflict *other;
  long lVar2;
  double dVar3;
  double dVar4;
  double local_58;
  double local_50;
  vertex_t *local_48;
  
  if (this->linecount == 0) {
    local_58 = this->planes[1].TexZ;
  }
  else {
    local_48 = (*this->lines)->v1;
    this_00 = &this->ceilingplane;
    local_58 = secplane_t::ZatPoint(this_00,local_48);
    local_50 = 3.4028234663852886e+38;
    for (lVar2 = 0; lVar2 < this->linecount; lVar2 = lVar2 + 1) {
      line = this->lines[lVar2];
      other = getNextSector(line,(sector_t_conflict *)this);
      if (other != (sector_t_conflict *)0x0) {
        dVar3 = secplane_t::ZatPoint(&other->ceilingplane,line->v1);
        dVar4 = secplane_t::ZatPoint(this_00,line->v1);
        if (((dVar4 < dVar3) && (dVar3 - dVar4 < local_50)) &&
           (bVar1 = IsLinked(this,other,true), !bVar1)) {
          local_48 = line->v1;
          local_58 = dVar3;
          local_50 = dVar3 - dVar4;
        }
        dVar3 = secplane_t::ZatPoint(&other->ceilingplane,line->v2);
        dVar4 = secplane_t::ZatPoint(this_00,line->v2);
        if (((dVar4 < dVar3) && (dVar3 - dVar4 < local_50)) &&
           (bVar1 = IsLinked(this,other,true), !bVar1)) {
          local_48 = line->v2;
          local_58 = dVar3;
          local_50 = dVar3 - dVar4;
        }
      }
    }
    if (v != (vertex_t **)0x0) {
      *v = local_48;
    }
  }
  return local_58;
}

Assistant:

double sector_t::FindNextHighestCeiling (vertex_t **v) const
{
	double height;
	double heightdiff;
	double oceil, ceil;
	sector_t *other;
	vertex_t *spot;
	line_t *check;
	int i;

	if (linecount == 0) return GetPlaneTexZ(sector_t::ceiling);

	spot = lines[0]->v1;
	height = ceilingplane.ZatPoint(spot);
	heightdiff = FLT_MAX;

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			oceil = other->ceilingplane.ZatPoint(check->v1);
			ceil = ceilingplane.ZatPoint(check->v1);
			if (oceil > ceil && oceil - ceil < heightdiff && !IsLinked(other, true))
			{
				heightdiff = oceil - ceil;
				height = oceil;
				spot = check->v1;
			}
			oceil = other->ceilingplane.ZatPoint(check->v2);
			ceil = ceilingplane.ZatPoint(check->v2);
			if (oceil > ceil && oceil - ceil < heightdiff && !IsLinked(other, true))
			{
				heightdiff = oceil - ceil;
				height = oceil;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}